

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_filesystem.cpp
# Opt level: O0

void test_translate_paths(test_table *table,char *universal,char *os)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  int64_t iVar4;
  char *test_universal;
  char *test_os;
  char *os_local;
  char *universal_local;
  test_table *table_local;
  
  if (table->result != (uint64_t *)0x0) {
    *table->result = 0;
  }
  pcVar3 = (*ne_filesystem_translate_universal_to_os)(table->result,universal);
  if (table->result != (uint64_t *)0x0) {
    bVar1 = test_validate(*table->result == table->expected_result,*table->result,
                          "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                          ,0x60,"TEST_EXPECT_RESULT(table->expected_result) failed\n");
    table->success = table->success & bVar1;
  }
  iVar4 = test_string_compare(pcVar3,os);
  bVar1 = test_validate(iVar4 == 0,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0x61,"TEST_EXPECT(test_string_compare(test_os, os) == 0) failed\n");
  table->success = table->success & bVar1;
  bVar2 = validate_any_path(pcVar3);
  bVar1 = test_validate(bVar2,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0x62,"TEST_EXPECT(validate_any_path(test_os)) failed\n");
  table->success = table->success & bVar1;
  if (table->result != (uint64_t *)0x0) {
    *table->result = 0;
  }
  (*ne_core_free)(table->result,pcVar3);
  if (table->result != (uint64_t *)0x0) {
    bVar1 = test_validate(*table->result == table->expected_result,*table->result,
                          "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                          ,0x66,"TEST_EXPECT_RESULT(table->expected_result) failed\n");
    table->success = table->success & bVar1;
  }
  if (table->result != (uint64_t *)0x0) {
    *table->result = 0;
  }
  pcVar3 = (*ne_filesystem_translate_os_to_universal)(table->result,os);
  if (table->result != (uint64_t *)0x0) {
    bVar1 = test_validate(*table->result == table->expected_result,*table->result,
                          "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                          ,0x6b,"TEST_EXPECT_RESULT(table->expected_result) failed\n");
    table->success = table->success & bVar1;
  }
  iVar4 = test_string_compare(pcVar3,universal);
  bVar1 = test_validate(iVar4 == 0,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0x6c,
                        "TEST_EXPECT(test_string_compare(test_universal, universal) == 0) failed\n")
  ;
  table->success = table->success & bVar1;
  bVar2 = validate_universal_canonical_path(pcVar3);
  bVar1 = test_validate(bVar2,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0x6d,
                        "TEST_EXPECT(validate_universal_canonical_path(test_universal)) failed\n");
  table->success = table->success & bVar1;
  if (table->result != (uint64_t *)0x0) {
    *table->result = 0;
  }
  (*ne_core_free)(table->result,pcVar3);
  if (table->result != (uint64_t *)0x0) {
    bVar1 = test_validate(*table->result == table->expected_result,*table->result,
                          "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                          ,0x71,"TEST_EXPECT_RESULT(table->expected_result) failed\n");
    table->success = table->success & bVar1;
  }
  return;
}

Assistant:

static void test_translate_paths(test_table *table,
                                 const char *universal,
                                 const char *os)
{
  TEST_CLEAR_RESULT();
  char *test_os =
      ne_filesystem_translate_universal_to_os(table->result, universal);
  TEST_EXPECT_TABLE_RESULT();
  TEST_EXPECT(test_string_compare(test_os, os) == 0);
  TEST_EXPECT(validate_any_path(test_os));

  TEST_CLEAR_RESULT();
  ne_core_free(table->result, test_os);
  TEST_EXPECT_TABLE_RESULT();

  TEST_CLEAR_RESULT();
  char *test_universal =
      ne_filesystem_translate_os_to_universal(table->result, os);
  TEST_EXPECT_TABLE_RESULT();
  TEST_EXPECT(test_string_compare(test_universal, universal) == 0);
  TEST_EXPECT(validate_universal_canonical_path(test_universal));

  TEST_CLEAR_RESULT();
  ne_core_free(table->result, test_universal);
  TEST_EXPECT_TABLE_RESULT();
}